

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

LY_ERR ly_path_compile_predicate_leafref
                 (lysc_node *ctx_node,lysc_node *cur_node,lyxp_expr *expr,uint32_t *tok_idx,
                 LY_VALUE_FORMAT format,void *prefix_data)

{
  ly_ctx *ctx_00;
  LY_ERR LVar1;
  char *pcVar2;
  bool bVar3;
  LY_ERR local_a4;
  lysc_node *local_90;
  LY_ERR ret__;
  ly_ctx *ctx;
  lysc_node *node2;
  lysc_node *node;
  lysc_node *key;
  void *pvStack_40;
  LY_ERR ret;
  void *prefix_data_local;
  uint32_t *puStack_30;
  LY_VALUE_FORMAT format_local;
  uint32_t *tok_idx_local;
  lyxp_expr *expr_local;
  lysc_node *cur_node_local;
  lysc_node *ctx_node_local;
  
  key._4_4_ = LY_SUCCESS;
  ctx_00 = cur_node->module->ctx;
  pvStack_40 = prefix_data;
  prefix_data_local._4_4_ = format;
  puStack_30 = tok_idx;
  tok_idx_local = (uint32_t *)expr;
  expr_local = (lyxp_expr *)cur_node;
  cur_node_local = ctx_node;
  LVar1 = lyxp_next_token((ly_ctx *)0x0,expr,tok_idx,LYXP_TOKEN_BRACK1);
  if (LVar1 == LY_SUCCESS) {
    if (cur_node_local->nodetype == 0x10) {
      if ((cur_node_local->flags & 0x200) == 0) {
        do {
          key._4_4_ = ly_path_compile_snode
                                (ctx_00,(lysc_node *)expr_local,(lys_module *)expr_local->tok_pos,
                                 cur_node_local,(lyxp_expr *)tok_idx_local,*puStack_30,
                                 prefix_data_local._4_4_,pvStack_40,(lysc_ext_instance *)0x0,0,&node
                                 ,(lysc_ext_instance **)0x0);
          if (key._4_4_ != LY_SUCCESS) break;
          if ((node->nodetype != 4) || ((node->flags & 0x100) == 0)) {
            pcVar2 = lys_nodetype2str(node->nodetype);
            ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,"Key expected instead of %s \"%s\" in path.",
                    pcVar2,node->name);
            key._4_4_ = LY_EVALID;
            break;
          }
          *puStack_30 = *puStack_30 + 1;
          if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 0xf) {
            __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_OPER_EQUAL",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                          ,0x36a,
                          "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                         );
          }
          *puStack_30 = *puStack_30 + 1;
          if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 0xd) {
            __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_FUNCNAME",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                          ,0x36e,
                          "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                         );
          }
          *puStack_30 = *puStack_30 + 1;
          node2 = (lysc_node *)expr_local;
          if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 1) {
            __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_PAR1",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                          ,0x375,
                          "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                         );
          }
          *puStack_30 = *puStack_30 + 1;
          if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 2) {
            __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_PAR2",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                          ,0x379,
                          "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                         );
          }
          *puStack_30 = *puStack_30 + 1;
          do {
            if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 0x14) {
              __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_OPER_PATH",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                            ,0x37e,
                            "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                           );
            }
            *puStack_30 = *puStack_30 + 1;
            if (node2 == (lysc_node *)0x0) {
              ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,"Too many parent references in path.");
              key._4_4_ = LY_EVALID;
              goto LAB_0011abda;
            }
            if (node2 == (lysc_node *)0x0) {
              local_90 = (lysc_node *)0x0;
            }
            else {
              local_90 = node2->parent;
            }
            node2 = lysc_data_node(local_90);
            if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 6) {
              __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_DDOT",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                            ,0x38a,
                            "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                           );
            }
            *puStack_30 = *puStack_30 + 1;
          } while (*(int *)(*(long *)tok_idx_local + (ulong)(*puStack_30 + 1) * 4) == 6);
          do {
            if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 0x14) {
              __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_OPER_PATH",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                            ,0x390,
                            "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                           );
            }
            *puStack_30 = *puStack_30 + 1;
            if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 10) {
              __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_NAMETEST",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                            ,0x394,
                            "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                           );
            }
            LVar1 = ly_path_compile_snode
                              (ctx_00,(lysc_node *)expr_local,(lys_module *)expr_local->tok_pos,
                               node2,(lyxp_expr *)tok_idx_local,*puStack_30,prefix_data_local._4_4_,
                               pvStack_40,(lysc_ext_instance *)0x0,0,(lysc_node **)&ctx,
                               (lysc_ext_instance **)0x0);
            if (LVar1 != LY_SUCCESS) {
              return LVar1;
            }
            node2 = (lysc_node *)ctx;
            *puStack_30 = *puStack_30 + 1;
            bVar3 = false;
            if (*puStack_30 + 1 < tok_idx_local[8]) {
              bVar3 = *(int *)(*(long *)tok_idx_local + (ulong)(*puStack_30 + 1) * 4) == 10;
            }
          } while (bVar3);
          if (*(short *)&(ctx->dict).hash_tab != 4) {
            pcVar2 = lys_nodetype2str(*(uint16_t *)&(ctx->dict).hash_tab);
            ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,
                    "Leaf expected instead of %s \"%s\" in leafref predicate in path.",pcVar2,
                    node2->name);
            key._4_4_ = LY_EVALID;
            break;
          }
          if (*(int *)(*(long *)tok_idx_local + (ulong)*puStack_30 * 4) != 4) {
            __assert_fail("expr->tokens[*tok_idx] == LYXP_TOKEN_BRACK2",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/path.c"
                          ,0x3a7,
                          "LY_ERR ly_path_compile_predicate_leafref(const struct lysc_node *, const struct lysc_node *, const struct lyxp_expr *, uint32_t *, LY_VALUE_FORMAT, void *)"
                         );
          }
          *puStack_30 = *puStack_30 + 1;
          LVar1 = lyxp_next_token((ly_ctx *)0x0,(lyxp_expr *)tok_idx_local,puStack_30,
                                  LYXP_TOKEN_BRACK1);
        } while (LVar1 == LY_SUCCESS);
      }
      else {
        pcVar2 = lys_nodetype2str(cur_node_local->nodetype);
        ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,
                "List predicate defined for keyless %s \"%s\" in path.",pcVar2,cur_node_local->name)
        ;
        key._4_4_ = LY_EVALID;
      }
    }
    else {
      pcVar2 = lys_nodetype2str(cur_node_local->nodetype);
      ly_vlog(ctx_00,(char *)0x0,LYVE_XPATH,"List predicate defined for %s \"%s\" in path.",pcVar2,
              cur_node_local->name);
      key._4_4_ = LY_EVALID;
    }
  }
LAB_0011abda:
  if (key._4_4_ == LY_ENOTFOUND) {
    local_a4 = LY_EVALID;
  }
  else {
    local_a4 = key._4_4_;
  }
  return local_a4;
}

Assistant:

static LY_ERR
ly_path_compile_predicate_leafref(const struct lysc_node *ctx_node, const struct lysc_node *cur_node,
        const struct lyxp_expr *expr, uint32_t *tok_idx, LY_VALUE_FORMAT format, void *prefix_data)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lysc_node *key, *node, *node2;
    struct ly_ctx *ctx = cur_node->module->ctx;

    if (lyxp_next_token(NULL, expr, tok_idx, LYXP_TOKEN_BRACK1)) {
        /* '[', no predicate */
        goto cleanup; /* LY_SUCCESS */
    }

    if (ctx_node->nodetype != LYS_LIST) {
        LOGVAL(ctx, LYVE_XPATH, "List predicate defined for %s \"%s\" in path.",
                lys_nodetype2str(ctx_node->nodetype), ctx_node->name);
        ret = LY_EVALID;
        goto cleanup;
    } else if (ctx_node->flags & LYS_KEYLESS) {
        LOGVAL(ctx, LYVE_XPATH, "List predicate defined for keyless %s \"%s\" in path.",
                lys_nodetype2str(ctx_node->nodetype), ctx_node->name);
        ret = LY_EVALID;
        goto cleanup;
    }

    do {
        /* NameTest, find the key */
        ret = ly_path_compile_snode(ctx, cur_node, cur_node->module, ctx_node, expr, *tok_idx, format, prefix_data,
                NULL, 0, &key, NULL);
        LY_CHECK_GOTO(ret, cleanup);
        if ((key->nodetype != LYS_LEAF) || !(key->flags & LYS_KEY)) {
            LOGVAL(ctx, LYVE_XPATH, "Key expected instead of %s \"%s\" in path.",
                    lys_nodetype2str(key->nodetype), key->name);
            ret = LY_EVALID;
            goto cleanup;
        }
        ++(*tok_idx);

        /* we are not actually compiling, throw the key away */
        (void)key;

        /* '=' */
        assert(expr->tokens[*tok_idx] == LYXP_TOKEN_OPER_EQUAL);
        ++(*tok_idx);

        /* FuncName */
        assert(expr->tokens[*tok_idx] == LYXP_TOKEN_FUNCNAME);
        ++(*tok_idx);

        /* evaluating from the "current()" node */
        node = cur_node;

        /* '(' */
        assert(expr->tokens[*tok_idx] == LYXP_TOKEN_PAR1);
        ++(*tok_idx);

        /* ')' */
        assert(expr->tokens[*tok_idx] == LYXP_TOKEN_PAR2);
        ++(*tok_idx);

        do {
            /* '/' */
            assert(expr->tokens[*tok_idx] == LYXP_TOKEN_OPER_PATH);
            ++(*tok_idx);

            /* go to parent */
            if (!node) {
                LOGVAL(ctx, LYVE_XPATH, "Too many parent references in path.");
                ret = LY_EVALID;
                goto cleanup;
            }
            node = lysc_data_parent(node);

            /* '..' */
            assert(expr->tokens[*tok_idx] == LYXP_TOKEN_DDOT);
            ++(*tok_idx);
        } while (expr->tokens[*tok_idx + 1] == LYXP_TOKEN_DDOT);

        do {
            /* '/' */
            assert(expr->tokens[*tok_idx] == LYXP_TOKEN_OPER_PATH);
            ++(*tok_idx);

            /* NameTest */
            assert(expr->tokens[*tok_idx] == LYXP_TOKEN_NAMETEST);
            LY_CHECK_RET(ly_path_compile_snode(ctx, cur_node, cur_node->module, node, expr, *tok_idx, format,
                    prefix_data, NULL, 0, &node2, NULL));
            node = node2;
            ++(*tok_idx);
        } while ((*tok_idx + 1 < expr->used) && (expr->tokens[*tok_idx + 1] == LYXP_TOKEN_NAMETEST));

        /* check the last target node */
        if (node->nodetype != LYS_LEAF) {
            LOGVAL(ctx, LYVE_XPATH, "Leaf expected instead of %s \"%s\" in leafref predicate in path.",
                    lys_nodetype2str(node->nodetype), node->name);
            ret = LY_EVALID;
            goto cleanup;
        }

        /* we are not actually compiling, throw the rightside node away */
        (void)node;

        /* ']' */
        assert(expr->tokens[*tok_idx] == LYXP_TOKEN_BRACK2);
        ++(*tok_idx);

        /* another predicate follows? */
    } while (!lyxp_next_token(NULL, expr, tok_idx, LYXP_TOKEN_BRACK1));

cleanup:
    return (ret == LY_ENOTFOUND) ? LY_EVALID : ret;
}